

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::clusterInverseSolutions(IMLE *this,int newSol1,int newSol2,int worseSol)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  pointer pFVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  double dVar8;
  uint uVar9;
  int iVar10;
  pointer pMVar11;
  ulong uVar12;
  undefined1 *puVar13;
  undefined8 *puVar14;
  long lVar15;
  Index IVar16;
  pointer pMVar17;
  double *pdVar18;
  undefined4 in_register_00000034;
  Index index;
  long lVar19;
  long lVar20;
  Index index_1;
  double *pdVar21;
  long lVar22;
  Index j;
  Index othersize;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__s;
  Index size_3;
  long lVar23;
  undefined1 *puVar24;
  double dVar25;
  Mat p;
  Z dist;
  Mat sol;
  ArrayZZ sum_invRp;
  scalar_sum_op<double,_double> local_149;
  DenseStorage<double,__1,__1,__1,_0> local_148;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  undefined1 *local_100;
  long local_f8;
  double local_f0;
  int local_e4;
  IMLE *local_e0;
  plainobjectbase_evaluator_data<double,_0> local_d8;
  long local_d0;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_c8;
  undefined1 local_b0 [16];
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_a0;
  DenseStorage<double,__1,__1,__1,_0> *local_88;
  undefined8 local_80;
  long local_78;
  double *local_70;
  undefined1 local_68 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_58;
  DenseStorage<double,__1,__1,__1,_0> *local_50;
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> local_40;
  pointer local_38;
  
  local_148.m_data = (double *)0x0;
  local_148.m_rows = 0;
  local_148.m_cols = 0;
  lVar19 = (long)this->M;
  lVar15 = (long)this->nInvSolFound;
  if ((lVar15 != 0 && lVar19 != 0) &&
     (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar6 / SEXT816(lVar15),0) < lVar19)) {
    puVar14 = (undefined8 *)
              __cxa_allocate_exception
                        (8,CONCAT44(in_register_00000034,newSol1),SUB168(auVar6 % SEXT816(lVar15),0)
                        );
    *puVar14 = operator_delete;
    __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,lVar15 * lVar19,lVar19,lVar15);
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  local_118.m_cols = 0;
  lVar19 = (long)this->d;
  lVar15 = (long)this->nInvSolFound;
  if ((lVar15 != 0 && lVar19 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar15),0) < lVar19)) {
    puVar14 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar14 = operator_delete;
    __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,lVar15 * lVar19,lVar19,lVar15);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector(&local_c8,(long)this->nInvSolFound,&this->zeroZZ,(allocator_type *)local_b0);
  if (1 < this->nInvSolFound) {
    lVar15 = 0;
    lVar19 = 0;
    do {
      pMVar11 = (pointer)local_118.m_rows;
      if ((((ulong)(local_118.m_data + local_118.m_rows * lVar19) & 7) == 0) &&
         (pMVar11 = (pointer)(ulong)((uint)((ulong)(local_118.m_data + local_118.m_rows * lVar19) >>
                                           3) & 1), local_118.m_rows <= (long)pMVar11)) {
        pMVar11 = (pointer)local_118.m_rows;
      }
      lVar23 = (long)(this->invPredictions).
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar19].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      if (0 < (long)pMVar11) {
        pMVar17 = (pointer)0x0;
        do {
          *(undefined8 *)((long)local_118.m_data + (long)pMVar17 * 8 + local_118.m_rows * lVar15) =
               *(undefined8 *)(lVar23 + (long)pMVar17 * 8);
          pMVar17 = (pointer)((long)&(pMVar17->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + 1);
        } while (pMVar11 != pMVar17);
      }
      lVar22 = local_118.m_rows - (long)pMVar11;
      pMVar17 = (pointer)((long)&(pMVar11->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data +
                         (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU));
      if (1 < lVar22) {
        do {
          puVar14 = (undefined8 *)(lVar23 + (long)pMVar11 * 8);
          uVar7 = puVar14[1];
          puVar1 = (undefined8 *)
                   ((long)local_118.m_data + (long)pMVar11 * 8 + local_118.m_rows * lVar15);
          *puVar1 = *puVar14;
          puVar1[1] = uVar7;
          pMVar11 = (pointer)((long)&(pMVar11->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + 2);
        } while ((long)pMVar11 < (long)pMVar17);
      }
      if ((long)pMVar17 < local_118.m_rows) {
        do {
          *(undefined8 *)((long)local_118.m_data + (long)pMVar17 * 8 + local_118.m_rows * lVar15) =
               *(undefined8 *)(lVar23 + (long)pMVar17 * 8);
          pMVar17 = (pointer)((long)&(pMVar17->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + 1);
        } while ((pointer)local_118.m_rows != pMVar17);
      }
      lVar19 = lVar19 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar19 < (long)this->nInvSolFound + -1);
  }
  pdVar21 = local_118.m_data + worseSol * local_118.m_rows;
  pMVar11 = (pointer)local_118.m_rows;
  if ((((ulong)pdVar21 & 7) == 0) &&
     (pMVar11 = (pointer)(ulong)((uint)((ulong)pdVar21 >> 3) & 1), local_118.m_rows <= (long)pMVar11
     )) {
    pMVar11 = (pointer)local_118.m_rows;
  }
  lVar15 = *(long *)&(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[newSol1].super_LinearExpert.pred_z.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  lVar19 = local_118.m_rows - (long)pMVar11;
  if (0 < (long)pMVar11) {
    pMVar17 = (pointer)0x0;
    do {
      pdVar21[(long)pMVar17] = *(double *)(lVar15 + (long)pMVar17 * 8);
      pMVar17 = (pointer)((long)&(pMVar17->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while (pMVar11 != pMVar17);
  }
  pMVar17 = (pointer)((long)&(pMVar11->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data + (lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffeU));
  if (1 < lVar19) {
    do {
      pdVar18 = (double *)(lVar15 + (long)pMVar11 * 8);
      dVar25 = pdVar18[1];
      pdVar21[(long)pMVar11] = *pdVar18;
      (pdVar21 + (long)pMVar11)[1] = dVar25;
      pMVar11 = (pointer)((long)&(pMVar11->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 2);
    } while ((long)pMVar11 < (long)pMVar17);
  }
  if ((long)pMVar17 < local_118.m_rows) {
    do {
      pdVar21[(long)pMVar17] = *(double *)(lVar15 + (long)pMVar17 * 8);
      pMVar17 = (pointer)((long)&(pMVar17->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while ((pointer)local_118.m_rows != pMVar17);
  }
  pdVar21 = local_118.m_data + ((long)this->nInvSolFound + -1) * local_118.m_rows;
  pMVar11 = (pointer)local_118.m_rows;
  if ((((ulong)pdVar21 & 7) == 0) &&
     (pMVar11 = (pointer)(ulong)((uint)((ulong)pdVar21 >> 3) & 1), local_118.m_rows <= (long)pMVar11
     )) {
    pMVar11 = (pointer)local_118.m_rows;
  }
  lVar15 = *(long *)&(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[newSol2].super_LinearExpert.pred_z.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  lVar19 = local_118.m_rows - (long)pMVar11;
  if (0 < (long)pMVar11) {
    pMVar17 = (pointer)0x0;
    do {
      pdVar21[(long)pMVar17] = *(double *)(lVar15 + (long)pMVar17 * 8);
      pMVar17 = (pointer)((long)&(pMVar17->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while (pMVar11 != pMVar17);
  }
  pMVar17 = (pointer)((long)&(pMVar11->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data + (lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffeU));
  if (1 < lVar19) {
    do {
      pdVar18 = (double *)(lVar15 + (long)pMVar11 * 8);
      dVar25 = pdVar18[1];
      pdVar21[(long)pMVar11] = *pdVar18;
      (pdVar21 + (long)pMVar11)[1] = dVar25;
      pMVar11 = (pointer)((long)&(pMVar11->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 2);
    } while ((long)pMVar11 < (long)pMVar17);
  }
  if ((long)pMVar17 < local_118.m_rows) {
    do {
      pdVar21[(long)pMVar17] = *(double *)(lVar15 + (long)pMVar17 * 8);
      pMVar17 = (pointer)((long)&(pMVar17->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while ((pointer)local_118.m_rows != pMVar17);
  }
  if (0 < (this->param).iterMax) {
    local_d8.data = (double *)&this->invRzj;
    iVar10 = 0;
    local_e0 = this;
    do {
      uVar9 = this->nInvSolFound;
      uVar12 = (ulong)uVar9;
      local_e4 = iVar10;
      if (0 < this->M) {
        lVar15 = 0;
        puVar24 = (undefined1 *)0x0;
        do {
          puVar13 = puVar24;
          if (0 < (int)uVar12) {
            local_f8 = (long)puVar24 * 0x308;
            lVar23 = 0;
            lVar19 = 0;
            local_100 = puVar24;
            local_d0 = lVar15;
            do {
              IVar16 = local_118.m_rows;
              pdVar21 = local_118.m_data;
              pFVar4 = (this->experts).
                       super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       .
                       super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_128.m_storage.m_data = (double *)0x0;
              local_128.m_storage.m_rows = 0;
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_128,local_118.m_rows,1);
              lVar15 = *(long *)((long)&(pFVar4->super_LinearExpert).pred_z + local_f8);
              pMVar11 = (pointer)IVar16;
              if (local_128.m_storage.m_rows != IVar16) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&local_128,IVar16,1);
                pMVar11 = (pointer)local_128.m_storage.m_rows;
              }
              this = local_e0;
              puVar13 = local_100;
              pMVar17 = (pointer)((long)pMVar11 - ((long)pMVar11 >> 0x3f) & 0xfffffffffffffffe);
              if (1 < (long)pMVar11) {
                lVar22 = 0;
                do {
                  pdVar18 = (double *)(lVar15 + lVar22 * 8);
                  dVar25 = pdVar18[1];
                  pdVar2 = (double *)((long)pdVar21 + lVar22 * 8 + IVar16 * lVar23);
                  dVar3 = pdVar2[1];
                  local_128.m_storage.m_data[lVar22] = *pdVar18 - *pdVar2;
                  (local_128.m_storage.m_data + lVar22)[1] = dVar25 - dVar3;
                  lVar22 = lVar22 + 2;
                } while (lVar22 < (long)pMVar17);
              }
              if ((long)pMVar17 < (long)pMVar11) {
                do {
                  local_128.m_storage.m_data[(long)pMVar17] =
                       *(double *)(lVar15 + (long)pMVar17 * 8) -
                       *(double *)((long)pdVar21 + (long)pMVar17 * 8 + IVar16 * lVar23);
                  pMVar17 = (pointer)((long)&(pMVar17->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             ).m_storage.m_data + 1);
                } while (pMVar11 != pMVar17);
              }
              local_68._8_8_ =
                   (local_e0->iInvRj).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)puVar24;
              local_68._0_8_ = &local_128;
              dVar25 = -0.0;
              local_58 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68._0_8_;
              if ((((pointer)local_68._8_8_)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
                  != 0) {
                local_b0._8_8_ = local_128.m_storage.m_data;
                Eigen::internal::
                product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                ::product_evaluator(&local_a0,(XprType *)(local_68 + 8));
                local_f0 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>,3,0>
                           ::
                           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                                       *)local_b0,&local_149,
                                      (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                                       *)local_68);
                free(local_a0.m_result.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    );
                dVar25 = local_f0 * -0.5;
              }
              dVar25 = exp(dVar25 / this->sumAll);
              local_148.m_data[(long)(puVar13 + local_148.m_rows * lVar19)] = dVar25;
              free(local_128.m_storage.m_data);
              lVar19 = lVar19 + 1;
              uVar12 = (ulong)this->nInvSolFound;
              lVar23 = lVar23 + 8;
              lVar15 = local_d0;
            } while (lVar19 < (long)uVar12);
          }
          if (local_148.m_cols != 0) {
            dVar25 = local_148.m_data[(long)puVar13];
            if (1 < local_148.m_cols) {
              lVar19 = local_148.m_cols + -1;
              pdVar21 = (double *)(lVar15 + local_148.m_rows * 8 + (long)local_148.m_data);
              do {
                dVar25 = dVar25 + *pdVar21;
                pdVar21 = pdVar21 + local_148.m_rows;
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
            }
            if (0 < local_148.m_cols && 0.0 < dVar25) {
              pdVar21 = (double *)((long)local_148.m_data + lVar15);
              IVar16 = local_148.m_cols;
              do {
                *pdVar21 = *pdVar21 / dVar25;
                pdVar21 = pdVar21 + local_148.m_rows;
                IVar16 = IVar16 + -1;
              } while (IVar16 != 0);
            }
          }
          if (0 < (int)uVar12) {
            lVar19 = 0;
            do {
              dVar25 = local_148.m_data[(long)(puVar13 + local_148.m_rows * lVar19)];
              lVar23 = (long)(this->iInvRj).
                             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)puVar24].
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data;
              pdVar21 = local_c8.
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar19].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data;
              lVar22 = local_c8.
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar19].
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols * local_c8.
                                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
              uVar12 = lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffe;
              if (1 < lVar22) {
                lVar20 = 0;
                do {
                  pdVar18 = (double *)(lVar23 + lVar20 * 8);
                  dVar8 = pdVar18[1];
                  dVar3 = (pdVar21 + lVar20)[1];
                  pdVar21[lVar20] = *pdVar18 * dVar25 + pdVar21[lVar20];
                  (pdVar21 + lVar20)[1] = dVar8 * dVar25 + dVar3;
                  lVar20 = lVar20 + 2;
                } while (lVar20 < (long)uVar12);
              }
              if ((long)uVar12 < lVar22) {
                do {
                  pdVar21[uVar12] = *(double *)(lVar23 + uVar12 * 8) * dVar25 + pdVar21[uVar12];
                  uVar12 = uVar12 + 1;
                } while (lVar22 - uVar12 != 0);
              }
              lVar19 = lVar19 + 1;
              uVar12 = (ulong)this->nInvSolFound;
            } while (lVar19 < (long)uVar12);
          }
          uVar9 = (uint)uVar12;
          puVar24 = puVar13 + 1;
          lVar15 = lVar15 + 8;
        } while ((long)puVar24 < (long)this->M);
      }
      if (0 < (int)uVar9) {
        dVar25 = 0.0;
        lVar15 = 0;
        pMVar11 = local_c8.
                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          IVar16 = local_118.m_rows;
          local_a0.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
                 (local_148.m_data + local_148.m_rows * lVar15);
          local_b0._0_8_ =
               (long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data + (long)dVar25;
          local_b0._8_8_ = local_d8.data;
          local_a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_data = (double *)local_148.m_rows;
          local_88 = &local_148;
          local_80 = 0;
          local_70 = (double *)local_148.m_rows;
          __s = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                (local_118.m_data + local_118.m_rows * lVar15);
          local_68._8_8_ = local_118.m_rows;
          local_50 = &local_118;
          local_48.m_value = 0;
          local_38 = (pointer)local_118.m_rows;
          pMVar11 = (pointer)local_118.m_rows;
          if ((((ulong)__s & 7) == 0) &&
             (pMVar11 = (pointer)(ulong)((uint)((ulong)__s >> 3) & 1),
             local_118.m_rows <= (long)pMVar11)) {
            pMVar11 = (pointer)local_118.m_rows;
          }
          local_f8 = lVar15;
          local_f0 = dVar25;
          local_78 = lVar15;
          local_68._0_8_ = __s;
          local_40.m_value = lVar15;
          if (0 < (long)pMVar11) {
            memset(__s,0,(long)pMVar11 * 8);
          }
          lVar15 = IVar16 - (long)pMVar11;
          puVar24 = (undefined1 *)
                    ((long)&(pMVar11->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU));
          if (1 < lVar15) {
            puVar13 = (undefined1 *)
                      ((long)&(pMVar11->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 2);
            if ((long)puVar13 < (long)puVar24) {
              puVar13 = puVar24;
            }
            local_100 = puVar24;
            memset(&(__s->m_storage).m_data + (long)pMVar11,0,
                   ((ulong)(puVar13 + ~(ulong)pMVar11) & 0xfffffffffffffffe) * 8 + 0x10);
            puVar24 = local_100;
          }
          if ((long)puVar24 < IVar16) {
            memset(&__s[lVar15 / 2].m_storage.m_data + (long)pMVar11,0,(lVar15 % 2) * 8);
          }
          local_128.m_storage.m_data = (double *)0x3ff0000000000000;
          Eigen::internal::
          generic_product_impl<Eigen::Inverse<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,0>,Eigen::DenseShape,Eigen::DenseShape,7>
          ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_68,
                     (Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b0,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      *)(local_b0 + 8),(Scalar *)&local_128);
          pMVar11 = local_c8.
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar25 = local_f0;
          lVar15 = *(long *)((long)&((local_c8.
                                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    ).m_storage.m_cols + (long)local_f0) *
                   *(long *)((long)&((local_c8.
                                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    ).m_storage.m_rows + (long)local_f0);
          if (0 < lVar15) {
            memset(*(void **)((long)&((local_c8.
                                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + (long)local_f0),0,lVar15 * 8);
          }
          lVar15 = local_f8 + 1;
          dVar25 = (double)((long)dVar25 + 0x18);
          this = local_e0;
        } while (lVar15 < local_e0->nInvSolFound);
      }
      iVar10 = local_e4 + 1;
    } while (iVar10 < (this->param).iterMax);
  }
  if (0 < this->M) {
    piVar5 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = 0;
    pdVar21 = local_148.m_data + local_148.m_rows;
    do {
      iVar10 = -(uint)(local_148.m_cols == 0);
      if (1 < local_148.m_cols) {
        dVar25 = local_148.m_data[lVar15];
        lVar23 = 1;
        lVar19 = 0;
        pdVar18 = pdVar21;
        do {
          dVar3 = *pdVar18;
          if (dVar25 < dVar3) {
            lVar19 = lVar23;
          }
          iVar10 = (int)lVar19;
          if (dVar3 <= dVar25) {
            dVar3 = dVar25;
          }
          dVar25 = dVar3;
          lVar23 = lVar23 + 1;
          pdVar18 = pdVar18 + local_148.m_rows;
        } while (local_148.m_cols != lVar23);
      }
      piVar5[lVar15] = iVar10;
      lVar15 = lVar15 + 1;
      pdVar21 = pdVar21 + 1;
    } while (lVar15 < this->M);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_c8);
  free(local_118.m_data);
  free(local_148.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}